

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O3

ScopeInfo *
Js::ScopeInfo::SaveScopeInfo
          (ByteCodeGenerator *byteCodeGenerator,Scope *scope,ScriptContext *scriptContext)

{
  FuncInfo *pFVar1;
  ScopeInfo *this;
  ScopeInfo *parent;
  
  if (scope != (Scope *)0x0) {
    do {
      if ((((*(ushort *)&scope->field_0x44 & 0x10) != 0) ||
          (pFVar1 = scope->func, pFVar1->bodyScope == scope)) ||
         ((pFVar1->paramScope == scope &&
          (((*(ushort *)&scope->field_0x44 >> 10 & 1) != 0 &&
           ((*(uint *)&pFVar1->field_0xb4 & 0x8000) != 0)))))) {
        if (scope->scopeType == ScopeType_Global) {
          return (ScopeInfo *)0x0;
        }
        if (scope->scopeInfo == (ScopeInfo *)0x0) {
          this = SaveOneScopeInfo(byteCodeGenerator,scope,scriptContext);
          if (scope->enclosingScope == (Scope *)0x0) {
            return this;
          }
          parent = SaveScopeInfo(byteCodeGenerator,scope->enclosingScope,scriptContext);
          SetParentScopeInfo(this,parent);
          return this;
        }
        return scope->scopeInfo;
      }
      scope = scope->enclosingScope;
    } while (scope != (Scope *)0x0);
  }
  return (ScopeInfo *)0x0;
}

Assistant:

ScopeInfo * ScopeInfo::SaveScopeInfo(ByteCodeGenerator* byteCodeGenerator, Scope * scope, ScriptContext * scriptContext)
    {
        // Advance past scopes that will be excluded from the closure environment. (But note that we always want the body scope.)
        while (scope)
        {
            FuncInfo* func = scope->GetFunc();

            if (scope->GetMustInstantiate() ||
                func->GetBodyScope() == scope ||
                (func->GetParamScope() == scope && func->IsBodyAndParamScopeMerged() && scope->GetHasNestedParamFunc()))
            {
                break;
            }

            scope = scope->GetEnclosingScope();
        }

        // If we've exhausted the scope chain, we're done.
        if (scope == nullptr || scope->GetScopeType() == ScopeType_Global)
        {
            return nullptr;
        }

        // If we've already collected info for this scope, we're done.
        ScopeInfo * scopeInfo = scope->GetScopeInfo();
        if (scopeInfo != nullptr)
        {
            return scopeInfo;
        }

        // Do the work for this scope.
        scopeInfo = ScopeInfo::SaveOneScopeInfo(byteCodeGenerator, scope, scriptContext);

        // Link to the parent (if any).
        scope = scope->GetEnclosingScope();
        if (scope)
        {
            scopeInfo->SetParentScopeInfo(ScopeInfo::SaveScopeInfo(byteCodeGenerator, scope, scriptContext));
        }

        return scopeInfo;
    }